

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O3

_Bool curses_are_equal(object *obj1,object *obj2)

{
  curse_data *pcVar1;
  curse_data *pcVar2;
  long lVar3;
  _Bool _Var4;
  bool bVar5;
  
  pcVar1 = obj1->curses;
  pcVar2 = obj2->curses;
  _Var4 = pcVar1 == (curse_data *)0x0 && pcVar2 == (curse_data *)0x0;
  if (pcVar2 != (curse_data *)0x0 && pcVar1 != (curse_data *)0x0) {
    if ((ulong)z_info->curse_max == 0) {
      return true;
    }
    lVar3 = 0;
    do {
      _Var4 = pcVar1[lVar3].power == pcVar2[lVar3].power;
      if (!_Var4) {
        return _Var4;
      }
      bVar5 = (ulong)z_info->curse_max - 1 != lVar3;
      lVar3 = lVar3 + 1;
    } while (bVar5);
  }
  return _Var4;
}

Assistant:

bool curses_are_equal(const struct object *obj1, const struct object *obj2)
{
	int i;

	if (!obj1->curses && !obj2->curses) return true;
	if (obj1->curses && !obj2->curses) return false;
	if (!obj1->curses && obj2->curses) return false;

	for (i = 0; i < z_info->curse_max; i++) {
		if (obj1->curses[i].power != obj2->curses[i].power) return false;
	}

	return true;
}